

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O2

void __thiscall
WebSocketsession::on_read(WebSocketsession *this,error_code eCode,size_t bytes_transferred)

{
  value_t vVar1;
  ulong_long_type uVar2;
  char *pcVar3;
  element_type *peVar4;
  json_value jVar5;
  bool bVar6;
  reference pvVar7;
  data *this_00;
  error_code eVar8;
  string_view body;
  json response;
  pair<RequestReturnVal,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  res;
  string local_288;
  data local_268;
  data local_258;
  data local_248;
  data local_238;
  data local_228;
  data local_218;
  data local_208;
  data local_1f8;
  undefined8 local_1e8;
  char *pcStack_1e0;
  element_type *local_1d8;
  json_value jStack_1d0;
  string local_1c8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_boost::container::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>_>
  reqpr;
  undefined1 local_180 [24];
  json_value ajStack_168 [40];
  
  eVar8 = boost::beast::websocket::make_error_code(closed);
  if (eCode.val_ == eVar8.val_) {
    uVar2 = (eVar8.cat_)->id_;
    bVar6 = (eCode.cat_)->id_ == uVar2;
    if (uVar2 == 0) {
      bVar6 = eVar8.cat_ == eCode.cat_;
    }
    if (bVar6) {
      return;
    }
  }
  if ((eCode._0_8_ >> 0x20 & 1) == 0) {
    pcVar3 = (this->buffer).in_;
    body._M_len = (long)(this->buffer).out_ - (long)pcVar3;
    body._M_str = pcVar3;
    processRequestParameters_abi_cxx11_(&reqpr,(string_view)(ZEXT816(0x3b52e4) << 0x40),body);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    local_1c8._M_string_length = 0;
    local_1e8 = 0;
    local_1c8.field_2._M_local_buf[0] = '\0';
    pcStack_1e0 = "";
    generateResults(&res,UNKNOWN,&local_1c8,(string_view)(ZEXT816(0x3b52e4) << 0x40),
                    (string_view)(ZEXT816(0x3b52e4) << 0x40),&reqpr.second);
    std::__cxx11::string::~string((string *)&local_1c8);
    peVar4 = (this->ws).impl_.px;
    pcVar3 = (this->buffer).begin_;
    (this->buffer).out_ = pcVar3;
    (this->buffer).in_ = pcVar3;
    peVar4->wr_opcode = text;
    if (((res.first == OK) && (res.second._M_string_length != 0)) &&
       (*res.second._M_dataplus._M_p == '{')) {
      boost::beast::detail::
      ostream_helper<boost::beast::basic_flat_buffer<std::allocator<char>_>,_char,_std::char_traits<char>,_true>
      ::ostream_helper((ostream_helper<boost::beast::basic_flat_buffer<std::allocator<char>_>,_char,_std::char_traits<char>,_true>
                        *)local_180,&this->buffer);
      std::operator<<((ostream *)local_180,(string *)&res.second);
      boost::beast::detail::
      ostream_helper<boost::beast::basic_flat_buffer<std::allocator<char>_>,_char,_std::char_traits<char>,_true>
      ::~ostream_helper((ostream_helper<boost::beast::basic_flat_buffer<std::allocator<char>_>,_char,_std::char_traits<char>,_true>
                         *)local_180);
      local_288._M_dataplus._M_p = (this->buffer).in_;
      local_288._M_string_length = (long)(this->buffer).out_ - (long)local_288._M_dataplus._M_p;
      std::__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<WebSocketsession,void>
                ((__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2> *)&response,
                 (__weak_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_180._0_8_ = on_write;
      local_180._8_8_ = 0;
      local_180._16_8_ = response.m_data._0_8_;
      ajStack_168[0] = response.m_data.m_value;
      response.m_data.m_type = null;
      response.m_data._1_7_ = 0;
      response.m_data.m_value.object = (object_t *)0x0;
      boost::beast::websocket::
      stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>
      ::
      async_write<boost::asio::mutable_buffer,_boost::beast::detail::bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<WebSocketsession>_>_>
                (&this->ws,(mutable_buffer *)&local_288,
                 (bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<WebSocketsession>_>
                  *)local_180);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)ajStack_168);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&response.m_data.m_value);
    }
    else {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&response,(nullptr_t)0x0);
      if (res.first == OK) {
        local_180._0_8_ = (ulong)(uint)local_180._4_4_ << 0x20;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<int,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_228,(int *)local_180);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&response,"status");
        vVar1 = (pvVar7->m_data).m_type;
        (pvVar7->m_data).m_type = local_228.m_type;
        jVar5 = (pvVar7->m_data).m_value;
        (pvVar7->m_data).m_value = local_228.m_value;
        local_228.m_type = vVar1;
        local_228.m_value = jVar5;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_228);
        this_00 = &local_268;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)this_00,&res.second);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&response,"value");
        vVar1 = (pvVar7->m_data).m_type;
        (pvVar7->m_data).m_type = local_268.m_type;
        local_268.m_type = vVar1;
      }
      else if (res.first == NOT_FOUND) {
        local_180._0_4_ = 0x194;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<int,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_208,(int *)local_180);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&response,"status");
        vVar1 = (pvVar7->m_data).m_type;
        (pvVar7->m_data).m_type = local_208.m_type;
        jVar5 = (pvVar7->m_data).m_value;
        (pvVar7->m_data).m_value = local_208.m_value;
        local_208.m_type = vVar1;
        local_208.m_value = jVar5;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_208);
        this_00 = &local_248;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)this_00,&res.second);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&response,"error");
        vVar1 = (pvVar7->m_data).m_type;
        (pvVar7->m_data).m_type = local_248.m_type;
        local_248.m_type = vVar1;
      }
      else if (res.first == BAD_REQUEST) {
        local_180._0_4_ = 400;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<int,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_1f8,(int *)local_180);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&response,"status");
        vVar1 = (pvVar7->m_data).m_type;
        (pvVar7->m_data).m_type = local_1f8.m_type;
        jVar5 = (pvVar7->m_data).m_value;
        (pvVar7->m_data).m_value = local_1f8.m_value;
        local_1f8.m_type = vVar1;
        local_1f8.m_value = jVar5;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_1f8);
        this_00 = &local_238;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)this_00,&res.second);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&response,"error");
        vVar1 = (pvVar7->m_data).m_type;
        (pvVar7->m_data).m_type = local_238.m_type;
        local_238.m_type = vVar1;
      }
      else {
        local_180._0_4_ = res.first;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json<int,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_218,(int *)local_180);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&response,"status");
        vVar1 = (pvVar7->m_data).m_type;
        (pvVar7->m_data).m_type = local_218.m_type;
        jVar5 = (pvVar7->m_data).m_value;
        (pvVar7->m_data).m_value = local_218.m_value;
        local_218.m_type = vVar1;
        local_218.m_value = jVar5;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_218);
        this_00 = &local_258;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)this_00,&res.second);
        pvVar7 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&response,"error");
        vVar1 = (pvVar7->m_data).m_type;
        (pvVar7->m_data).m_type = local_258.m_type;
        local_258.m_type = vVar1;
      }
      jVar5 = (pvVar7->m_data).m_value;
      (pvVar7->m_data).m_value = this_00->m_value;
      this_00->m_value = jVar5;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(this_00);
      boost::beast::detail::
      ostream_helper<boost::beast::basic_flat_buffer<std::allocator<char>_>,_char,_std::char_traits<char>,_true>
      ::ostream_helper((ostream_helper<boost::beast::basic_flat_buffer<std::allocator<char>_>,_char,_std::char_traits<char>,_true>
                        *)local_180,&this->buffer);
      helics::fileops::generateJsonString(&local_288,&response,true);
      std::operator<<((ostream *)local_180,(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      boost::beast::detail::
      ostream_helper<boost::beast::basic_flat_buffer<std::allocator<char>_>,_char,_std::char_traits<char>,_true>
      ::~ostream_helper((ostream_helper<boost::beast::basic_flat_buffer<std::allocator<char>_>,_char,_std::char_traits<char>,_true>
                         *)local_180);
      local_288._M_dataplus._M_p = (this->buffer).in_;
      local_288._M_string_length = (long)(this->buffer).out_ - (long)local_288._M_dataplus._M_p;
      std::__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<WebSocketsession,void>
                ((__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2> *)&local_1d8,
                 (__weak_ptr<WebSocketsession,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_180._0_8_ = on_write;
      local_180._8_8_ = 0;
      local_180._16_8_ = local_1d8;
      ajStack_168[0] = jStack_1d0;
      local_1d8 = (element_type *)0x0;
      jStack_1d0.object = (object_t *)0x0;
      boost::beast::websocket::
      stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_true>
      ::
      async_write<boost::asio::mutable_buffer,_boost::beast::detail::bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<WebSocketsession>_>_>
                (&this->ws,(mutable_buffer *)&local_288,
                 (bind_front_wrapper<void_(WebSocketsession::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<WebSocketsession>_>
                  *)local_180);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)ajStack_168);
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&jStack_1d0);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&response.m_data);
    }
    std::__cxx11::string::~string((string *)&res.second);
    boost::container::
    vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
    ::~vector((vector<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
               *)&reqpr.second);
    return;
  }
  fail(eCode,"helics web server read");
  return;
}

Assistant:

void on_read(beast::error_code eCode, std::size_t bytes_transferred)
    {
        boost::ignore_unused(bytes_transferred);

        // This indicates that the session was closed
        if (eCode == websocket::error::closed) {
            return;
        }

        if (eCode) {
            return fail(eCode, "helics web server read");
        }

        // const std::string_view result{boost::asio::buffer_cast<const char*>(buffer.data()),
        //                              buffer.size()};
        const std::string_view result{reinterpret_cast<const char*>(buffer.data().data()),
                                      buffer.size()};
        // Echo the message
        auto reqpr = processRequestParameters("", result);

        const RestCommand command{RestCommand::UNKNOWN};

        auto res = generateResults(command, {}, "", "", reqpr.second);
        // Clear the buffer
        buffer.consume(buffer.size());

        ws.text(true);
        if (res.first == RequestReturnVal::OK && !res.second.empty() && res.second.front() == '{') {
            boost::beast::ostream(buffer) << res.second;  // NOLINT
            ws.async_write(buffer.data(),
                           beast::bind_front_handler(&WebSocketsession::on_write,
                                                     shared_from_this()));
            return;
        }
        nlohmann::json response;
        switch (res.first) {
            case RequestReturnVal::BAD_REQUEST:
                response["status"] = static_cast<int>(http::status::bad_request);
                response["error"] = res.second;
                break;
            case RequestReturnVal::NOT_FOUND:
                response["status"] = static_cast<int>(http::status::not_found);
                response["error"] = res.second;
                break;
            default:
                response["status"] = static_cast<int>(res.first);
                response["error"] = res.second;
                break;
            case RequestReturnVal::OK:
                response["status"] = 0;
                response["value"] = res.second;
                break;
        }

        boost::beast::ostream(buffer) << helics::fileops::generateJsonString(response);  // NOLINT
        ws.async_write(buffer.data(),
                       beast::bind_front_handler(&WebSocketsession::on_write, shared_from_this()));
    }